

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O1

void __thiscall DArgs::RemoveArgs(DArgs *this,char *check)

{
  char cVar1;
  FString *pFVar2;
  int iVar3;
  uint index;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(this->Argv).Count;
  index = 0;
  if (1 < uVar5) {
    pFVar2 = (this->Argv).Array;
    uVar4 = 1;
    do {
      iVar3 = strcasecmp(check,pFVar2[uVar4].Chars);
      if (iVar3 == 0) {
        index = (uint)uVar4;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  if ((0 < (int)index) && ((int)index < (int)((this->Argv).Count - 1))) {
    do {
      TArray<FString,_FString>::Delete(&this->Argv,index);
      cVar1 = *(this->Argv).Array[index].Chars;
      if (cVar1 == '+') {
        return;
      }
      if (cVar1 == '-') {
        return;
      }
    } while ((int)index < (int)((this->Argv).Count - 1));
  }
  return;
}

Assistant:

void DArgs::RemoveArgs(const char *check)
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		do 
		{
			RemoveArg(i);
		}
		while (Argv[i][0] != '+' && Argv[i][0] != '-' && i < (int)Argv.Size() - 1);
	}
}